

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O2

RemoveResponse * __thiscall
Future<RemoveResponse>::get(RemoveResponse *__return_storage_ptr__,Future<RemoveResponse> *this)

{
  element_type *peVar1;
  RemoveResponse RStack_48;
  
  if ((this->is_done_ == false) &&
     (peVar1 = (this->task_).
               super___shared_ptr<AsyncTask<RemoveResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    (**peVar1->_vptr_AsyncTask)(&RStack_48);
    RemoveResponse::operator=(&this->result_,&RStack_48);
    RemoveResponse::~RemoveResponse(&RStack_48);
    this->is_done_ = true;
  }
  RemoveResponse::RemoveResponse(__return_storage_ptr__,&this->result_);
  return __return_storage_ptr__;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }